

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * CompileVmZeroInitialize(ExpressionContext *ctx,VmModule *module,ExprZeroInitialize *node)

{
  VmModule *pVVar1;
  SynBase *source;
  VmType VVar2;
  VmValueType VVar3;
  undefined8 uVar4;
  TypeBase *address_00;
  bool bVar5;
  uint count;
  TypeRef *pTVar6;
  VmConstant *pVVar7;
  VmConstant *pVVar8;
  VmConstant *el1;
  VmValue *pVVar9;
  VmType type;
  VmType type_00;
  VmType type_01;
  VmType type_02;
  VmValue *in_stack_fffffffffffffe98;
  VmValue *initializer_5;
  VmValue *initializer_4;
  VmValue *initializer_3;
  VmValue *initializer_2;
  VmValue *initializer_1;
  VmValue *initializer;
  VmType vmType;
  VmValue *address;
  TypeRef *refType;
  ExprZeroInitialize *node_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  pTVar6 = getType<TypeRef>(node->address->type);
  if (pTVar6 == (TypeRef *)0x0) {
    __assert_fail("refType",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xd7d,
                  "VmValue *CompileVmZeroInitialize(ExpressionContext &, VmModule *, ExprZeroInitialize *)"
                 );
  }
  vmType.structType = (TypeBase *)CompileVm(ctx,module,node->address);
  _initializer = GetVmType(ctx,pTVar6->subType);
  bVar5 = VmType::operator==((VmType *)&initializer,&VmType::Int);
  if (((bVar5) || (bVar5 = VmType::operator==((VmType *)&initializer,&VmType::Double), bVar5)) ||
     (bVar5 = VmType::operator==((VmType *)&initializer,&VmType::Long),
     address_00 = vmType.structType, bVar5)) {
    pVVar7 = CreateConstantZero(ctx->allocator,(node->super_ExprBase).source,_initializer);
    anon_unknown.dwarf_c91b1::CreateStore
              (ctx,module,(node->super_ExprBase).source,pTVar6->subType,(VmValue *)vmType.structType
               ,&pVVar7->super_VmValue,0);
  }
  else {
    VVar3 = (VmValueType)initializer;
    if ((VmValueType)initializer == VM_TYPE_POINTER) {
      pVVar7 = CreateConstantPointer
                         (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                          pTVar6->subType,false);
      anon_unknown.dwarf_c91b1::CreateStore
                (ctx,module,(node->super_ExprBase).source,pTVar6->subType,
                 (VmValue *)vmType.structType,&pVVar7->super_VmValue,0);
    }
    else {
      bVar5 = (VmValueType)initializer == VM_TYPE_FUNCTION_REF;
      pVVar9 = initializer;
      uVar4 = vmType._0_8_;
      if (bVar5) {
        pVVar1 = (VmModule *)(node->super_ExprBase).source;
        pVVar7 = CreateConstantPointer
                           (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                            ctx->typeNullPtr,false);
        pVVar8 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,0);
        VVar2 = _initializer;
        type.structType = (TypeBase *)pVVar7;
        vmType.type = (VmValueType)uVar4;
        vmType.size = SUB84(uVar4,4);
        type.type = vmType.type;
        type.size = vmType.size;
        _initializer = VVar2;
        pVVar9 = anon_unknown.dwarf_c91b1::CreateConstruct
                           ((anon_unknown_dwarf_c91b1 *)module,pVVar1,(SynBase *)pVVar9,type,
                            &pVVar8->super_VmValue,(VmValue *)0x0,(VmValue *)0x0,
                            in_stack_fffffffffffffe98);
        anon_unknown.dwarf_c91b1::CreateStore
                  (ctx,module,(node->super_ExprBase).source,pTVar6->subType,
                   (VmValue *)vmType.structType,pVVar9,0);
      }
      else if (VVar3 == VM_TYPE_ARRAY_REF) {
        pVVar1 = (VmModule *)(node->super_ExprBase).source;
        pVVar7 = CreateConstantPointer
                           (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                            ctx->typeNullPtr,false);
        pVVar8 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,0);
        VVar2 = _initializer;
        type_00.structType = (TypeBase *)pVVar7;
        vmType.type = (VmValueType)uVar4;
        vmType.size = SUB84(uVar4,4);
        type_00.type = vmType.type;
        type_00.size = vmType.size;
        _initializer = VVar2;
        pVVar9 = anon_unknown.dwarf_c91b1::CreateConstruct
                           ((anon_unknown_dwarf_c91b1 *)module,pVVar1,(SynBase *)pVVar9,type_00,
                            &pVVar8->super_VmValue,(VmValue *)0x0,(VmValue *)0x0,
                            in_stack_fffffffffffffe98);
        anon_unknown.dwarf_c91b1::CreateStore
                  (ctx,module,(node->super_ExprBase).source,pTVar6->subType,
                   (VmValue *)vmType.structType,pVVar9,0);
      }
      else if (VVar3 == VM_TYPE_AUTO_REF) {
        pVVar1 = (VmModule *)(node->super_ExprBase).source;
        pVVar7 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,0);
        pVVar8 = CreateConstantPointer
                           (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                            ctx->typeNullPtr,false);
        VVar2 = _initializer;
        type_01.structType = (TypeBase *)pVVar7;
        vmType.type = (VmValueType)uVar4;
        vmType.size = SUB84(uVar4,4);
        type_01.type = vmType.type;
        type_01.size = vmType.size;
        _initializer = VVar2;
        pVVar9 = anon_unknown.dwarf_c91b1::CreateConstruct
                           ((anon_unknown_dwarf_c91b1 *)module,pVVar1,(SynBase *)pVVar9,type_01,
                            &pVVar8->super_VmValue,(VmValue *)0x0,(VmValue *)0x0,
                            in_stack_fffffffffffffe98);
        anon_unknown.dwarf_c91b1::CreateStore
                  (ctx,module,(node->super_ExprBase).source,pTVar6->subType,
                   (VmValue *)vmType.structType,pVVar9,0);
      }
      else if (VVar3 == VM_TYPE_AUTO_ARRAY) {
        pVVar1 = (VmModule *)(node->super_ExprBase).source;
        pVVar7 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,0);
        pVVar8 = CreateConstantPointer
                           (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                            ctx->typeNullPtr,false);
        el1 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,0);
        VVar2 = _initializer;
        type_02.structType = (TypeBase *)pVVar7;
        vmType.type = (VmValueType)uVar4;
        vmType.size = SUB84(uVar4,4);
        type_02.type = vmType.type;
        type_02.size = vmType.size;
        _initializer = VVar2;
        pVVar9 = anon_unknown.dwarf_c91b1::CreateConstruct
                           ((anon_unknown_dwarf_c91b1 *)module,pVVar1,(SynBase *)pVVar9,type_02,
                            &pVVar8->super_VmValue,&el1->super_VmValue,(VmValue *)0x0,
                            in_stack_fffffffffffffe98);
        anon_unknown.dwarf_c91b1::CreateStore
                  (ctx,module,(node->super_ExprBase).source,pTVar6->subType,
                   (VmValue *)vmType.structType,pVVar9,0);
      }
      else {
        if (VVar3 != VM_TYPE_STRUCT) {
          __assert_fail("!\"unknown type\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0xdae,
                        "VmValue *CompileVmZeroInitialize(ExpressionContext &, VmModule *, ExprZeroInitialize *)"
                       );
        }
        if (initializer._4_4_ != 0) {
          source = (node->super_ExprBase).source;
          count = initializer._4_4_ >> 2;
          VVar2.structType = VmType::Int.structType;
          VVar2.type = VmType::Int.type;
          VVar2.size = VmType::Int.size;
          pVVar7 = CreateConstantZero(ctx->allocator,(node->super_ExprBase).source,VVar2);
          anon_unknown.dwarf_c91b1::CreateSetRange
                    (module,source,(VmValue *)address_00,count,&pVVar7->super_VmValue,4);
        }
      }
    }
  }
  pVVar9 = anon_unknown.dwarf_c91b1::CreateVoid(module);
  pVVar9 = anon_unknown.dwarf_c91b1::CheckType(ctx,&node->super_ExprBase,pVVar9);
  return pVVar9;
}

Assistant:

VmValue* CompileVmZeroInitialize(ExpressionContext &ctx, VmModule *module, ExprZeroInitialize *node)
{
	TypeRef *refType = getType<TypeRef>(node->address->type);

	assert(refType);

	VmValue *address = CompileVm(ctx, module, node->address);

	VmType vmType = GetVmType(ctx, refType->subType);

	if(vmType == VmType::Int || vmType == VmType::Double || vmType == VmType::Long)
	{
		VmValue *initializer = CreateConstantZero(ctx.allocator, node->source, vmType);

		CreateStore(ctx, module, node->source, refType->subType, address, initializer, 0);
	}
	else if(vmType.type == VM_TYPE_POINTER)
	{
		VmValue *initializer = CreateConstantPointer(module->allocator, node->source, 0, NULL, refType->subType, false);

		CreateStore(ctx, module, node->source, refType->subType, address, initializer, 0);
	}
	else if(vmType.type == VM_TYPE_FUNCTION_REF)
	{
		VmValue *initializer = CreateConstruct(module, node->source, vmType, CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), CreateConstantInt(module->allocator, node->source, 0), NULL, NULL);

		CreateStore(ctx, module, node->source, refType->subType, address, initializer, 0);
	}
	else if(vmType.type == VM_TYPE_ARRAY_REF)
	{
		VmValue *initializer = CreateConstruct(module, node->source, vmType, CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), CreateConstantInt(module->allocator, node->source, 0), NULL, NULL);

		CreateStore(ctx, module, node->source, refType->subType, address, initializer, 0);
	}
	else if(vmType.type == VM_TYPE_AUTO_REF)
	{
		VmValue *initializer = CreateConstruct(module, node->source, vmType, CreateConstantInt(module->allocator, node->source, 0), CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), NULL, NULL);

		CreateStore(ctx, module, node->source, refType->subType, address, initializer, 0);
	}
	else if(vmType.type == VM_TYPE_AUTO_ARRAY)
	{
		VmValue *initializer = CreateConstruct(module, node->source, vmType, CreateConstantInt(module->allocator, node->source, 0), CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), CreateConstantInt(module->allocator, node->source, 0), NULL);

		CreateStore(ctx, module, node->source, refType->subType, address, initializer, 0);
	}
	else if(vmType.type == VM_TYPE_STRUCT)
	{
		if(vmType.size != 0)
			CreateSetRange(module, node->source, address, vmType.size / 4, CreateConstantZero(ctx.allocator, node->source, VmType::Int), 4);
	}
	else// if(vmType != VmType::Void)
	{
		assert(!"unknown type");
	}

	return CheckType(ctx, node, CreateVoid(module));
}